

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall xmrig::Network::getResults(Network *this,Value *reply,Document *doc,int version)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  uint32_t value;
  SizeType SVar1;
  long lVar2;
  Value results;
  Value best;
  Data local_c8;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  results.data_.n = (Number)0x0;
  results.data_.s.str = (Ch *)0x3000000000000;
  local_40.s = "diff_current";
  SVar1 = 0xc;
  local_40.length = SVar1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(&results,&local_40,(this->m_state).diff,allocator);
  local_50.s = "shares_good";
  local_50.length = 0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(&results,&local_50,(this->m_state).accepted,allocator);
  local_60.s = "shares_total";
  local_60.length = SVar1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (&results,&local_60,(this->m_state).rejected + (this->m_state).accepted,allocator);
  local_70.s = "avg_time";
  local_70.length = 8;
  value = NetworkState::avgTime(&this->m_state);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(&results,&local_70,value,allocator);
  local_80.s = "hashes_total";
  local_80.length = SVar1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(&results,&local_80,(this->m_state).total,allocator);
  best.data_.n = (Number)0x0;
  best.data_.s.str = (Ch *)0x4000000000000;
  for (lVar2 = -0x50; lVar2 != 0; lVar2 = lVar2 + 8) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_long>
              (&best,*(unsigned_long *)((long)(&(this->m_state).topDiff + 1) + lVar2),allocator);
  }
  local_90.s = "best";
  local_90.length = 4;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&results,&local_90,&best,allocator);
  if (version == 1) {
    local_a0.s = "error_log";
    local_a0.length = 9;
    local_c8.n.i64 = (Number)0x0;
    local_c8.s.str = (Ch *)0x4000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&results,&local_a0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,allocator);
  }
  local_b0.s = "results";
  local_b0.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(reply,&local_b0,&results,allocator);
  return;
}

Assistant:

void xmrig::Network::getResults(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value results(kObjectType);

    results.AddMember("diff_current",  m_state.diff, allocator);
    results.AddMember("shares_good",   m_state.accepted, allocator);
    results.AddMember("shares_total",  m_state.accepted + m_state.rejected, allocator);
    results.AddMember("avg_time",      m_state.avgTime(), allocator);
    results.AddMember("hashes_total",  m_state.total, allocator);

    Value best(kArrayType);
    for (uint64_t i : m_state.topDiff) {
        best.PushBack(i, allocator);
    }

    results.AddMember("best", best, allocator);

    if (version == 1) {
        results.AddMember("error_log", Value(kArrayType), allocator);
    }

    reply.AddMember("results", results, allocator);
}